

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Enum::MergeFrom(Enum *this,Enum *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  string *initial_value;
  string *psVar2;
  LogMessage *other;
  SourceContext *pSVar3;
  Arena *pAVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/type.pb.cc"
               ,0x5fe);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
            (&(this->enumvalue_).super_RepeatedPtrFieldBase,
             &(from->enumvalue_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Option>::TypeHandler>
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(from->options_).super_RepeatedPtrFieldBase);
  initial_value = (from->name_).ptr_;
  if (initial_value->_M_string_length != 0) {
    pAVar4 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    psVar2 = (this->name_).ptr_;
    if (psVar2 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar4,initial_value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if ((from != (Enum *)_Enum_default_instance_) && (from->source_context_ != (SourceContext *)0x0))
  {
    if (this->source_context_ == (SourceContext *)0x0) {
      pAVar4 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      pSVar3 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar4);
      this->source_context_ = pSVar3;
    }
    pSVar3 = from->source_context_;
    if (pSVar3 == (SourceContext *)0x0) {
      pSVar3 = (SourceContext *)&_SourceContext_default_instance_;
    }
    SourceContext::MergeFrom(this->source_context_,pSVar3);
  }
  if (from->syntax_ != 0) {
    this->syntax_ = from->syntax_;
  }
  return;
}

Assistant:

void Enum::MergeFrom(const Enum& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Enum)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  enumvalue_.MergeFrom(from.enumvalue_);
  options_.MergeFrom(from.options_);
  if (from.name().size() > 0) {
    _internal_set_name(from._internal_name());
  }
  if (from.has_source_context()) {
    _internal_mutable_source_context()->PROTOBUF_NAMESPACE_ID::SourceContext::MergeFrom(from._internal_source_context());
  }
  if (from.syntax() != 0) {
    _internal_set_syntax(from._internal_syntax());
  }
}